

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read669.c
# Opt level: O1

int it_669_read_sample_data(IT_SAMPLE *sample,DUMBFILE *f)

{
  byte *pbVar1;
  int iVar2;
  int32 iVar3;
  int iVar4;
  char *ptr;
  long lVar5;
  
  if ((sample->flags & 0x10) != 0) {
    iVar4 = sample->loop_end;
    iVar2 = sample->length - iVar4;
    if (iVar2 != 0 && iVar4 <= sample->length) {
      sample->length = iVar4;
      lVar5 = (long)iVar2;
      goto LAB_006eb700;
    }
  }
  lVar5 = 0;
LAB_006eb700:
  iVar4 = sample->length;
  ptr = (char *)malloc((long)iVar4);
  sample->data = ptr;
  if (ptr == (char *)0x0) {
    return -1;
  }
  if (iVar4 != 0) {
    iVar3 = dumbfile_getnc(ptr,iVar4,f);
    if (iVar3 < sample->length) {
      if (iVar3 < 1) {
        sample->flags = '\0';
        return 0;
      }
      sample->length = iVar3;
      if (iVar3 < sample->loop_end) {
        sample->loop_end = iVar3;
      }
    }
    else {
      dumbfile_skip(f,lVar5);
      iVar4 = dumbfile_error(f);
      if (iVar4 != 0) {
        return -1;
      }
    }
    if (0 < sample->length) {
      lVar5 = 0;
      do {
        pbVar1 = (byte *)((long)sample->data + lVar5);
        *pbVar1 = *pbVar1 ^ 0x80;
        lVar5 = lVar5 + 1;
      } while (lVar5 < sample->length);
    }
  }
  return 0;
}

Assistant:

static int it_669_read_sample_data(IT_SAMPLE *sample, DUMBFILE *f)
{
	int32 i;
	int32 truncated_size;

	/* let's get rid of the sample data coming after the end of the loop */
	if ((sample->flags & IT_SAMPLE_LOOP) && sample->loop_end < sample->length) {
		truncated_size = sample->length - sample->loop_end;
		sample->length = sample->loop_end;
	} else {
		truncated_size = 0;
	}

	sample->data = malloc(sample->length);

	if (!sample->data)
		return -1;

	if (sample->length)
	{
		i = dumbfile_getnc(sample->data, sample->length, f);
		
		if (i < sample->length) {
			//return -1;
			// ficking truncated files
			if (i <= 0) {
				sample->flags = 0;
				return 0;
			}
			sample->length = i;
			if (sample->loop_end > i) sample->loop_end = i;
		} else {
			/* skip truncated data */
			dumbfile_skip(f, truncated_size);
			// Should we be truncating it?
			if (dumbfile_error(f))
				return -1;
		}

		for (i = 0; i < sample->length; i++)
			((signed char *)sample->data)[i] ^= 0x80;
	}

	return 0;
}